

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedCloseWebSocket::pumpTo
          (DelayedCloseWebSocket *this,WebSocket *other)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  ChainPromiseNode *pCVar2;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  Own<kj::_::ChainPromiseNode> OVar3;
  Promise<void> PVar4;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  (**(code **)(*other[2]._vptr_WebSocket + 0x38))(&local_48);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_48,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4386:40),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00446730;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)other;
  local_38.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::pumpTo(kj::WebSocket&)::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  local_38.ptr = (PromiseNode *)this_00;
  OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_28,&local_38);
  pPVar1 = local_38.ptr;
  pCVar2 = OVar3.ptr;
  *(undefined4 *)&(this->super_WebSocket)._vptr_WebSocket = local_28;
  *(undefined4 *)((long)&(this->super_WebSocket)._vptr_WebSocket + 4) = uStack_24;
  *(undefined4 *)&(this->inner).disposer = uStack_20;
  *(undefined4 *)((long)&(this->inner).disposer + 4) = uStack_1c;
  if ((TransformPromiseNodeBase *)local_38.ptr != (TransformPromiseNodeBase *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    (**(local_38.disposer)->_vptr_Disposer)
              (local_38.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pCVar2 = extraout_RDX;
  }
  pPVar1 = local_48.ptr;
  if (local_48.ptr != (PromiseNode *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pCVar2 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = &pCVar2->super_PromiseNode;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
      return inner->pumpTo(other).then([this]() {
        return afterReceiveClosed();
      });
    }